

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall Liby::io_task::io_task(io_task *this,io_task *that)

{
  off_t oVar1;
  
  (this->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->offset_ = 0;
  this->len_ = 0;
  (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->handler_)._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl = (function<void_()> *)0x0;
  std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *)that);
  oVar1 = that->len_;
  this->offset_ = that->offset_;
  this->len_ = oVar1;
  std::__shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>,
             &(that->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

io_task::io_task(const io_task &that) {
    fp_ = that.fp_;
    offset_ = that.offset_;
    len_ = that.len_;
    buffer_ = that.buffer_;
}